

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void pcache1EnforceMaxPage(PCache1 *pCache)

{
  PGroup *pPVar1;
  PgHdr1 *pPage;
  
  pPVar1 = pCache->pGroup;
  while ((pPVar1->nMaxPage < pPVar1->nCurrentPage &&
         (pPage = (pPVar1->lru).pLruPrev, pPage->isAnchor == '\0'))) {
    pcache1PinPage(pPage);
    pcache1RemoveFromHash(pPage,1);
  }
  if ((pCache->nPage == 0) && (pCache->pBulk != (void *)0x0)) {
    sqlite3_free(pCache->pBulk);
    pCache->pFree = (PgHdr1 *)0x0;
    pCache->pBulk = (void *)0x0;
  }
  return;
}

Assistant:

static void pcache1EnforceMaxPage(PCache1 *pCache){
  PGroup *pGroup = pCache->pGroup;
  PgHdr1 *p;
  assert( sqlite3_mutex_held(pGroup->mutex) );
  while( pGroup->nCurrentPage>pGroup->nMaxPage
      && (p=pGroup->lru.pLruPrev)->isAnchor==0
  ){
    assert( p->pCache->pGroup==pGroup );
    assert( p->isPinned==0 );
    pcache1PinPage(p);
    pcache1RemoveFromHash(p, 1);
  }
  if( pCache->nPage==0 && pCache->pBulk ){
    sqlite3_free(pCache->pBulk);
    pCache->pBulk = pCache->pFree = 0;
  }
}